

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

uint __thiscall
ON_SubDimple::DeleteComponents
          (ON_SubDimple *this,uint level_index,bool bDeleteIsolatedEdges,
          bool bUpdateTagsAndCoefficients,bool bMarkDeletedFaceEdges)

{
  ON_SubDHeap *this_00;
  unsigned_short uVar1;
  undefined2 uVar20;
  undefined2 uVar21;
  ON_SubDLevel *this_01;
  ON_SubDFace *pOVar2;
  ON_SubDEdge *pOVar3;
  ON_SubDVertex *pOVar4;
  bool bVar5;
  bool bVar6;
  ushort uVar7;
  uint uVar8;
  ON_SubDFacePtr *pOVar9;
  unsigned_short fei;
  ushort uVar10;
  ON_SubDEdge *pOVar11;
  unsigned_short uVar12;
  ushort uVar13;
  ON_SubDFacePtr *pOVar14;
  ulong uVar15;
  ulong uVar16;
  ON_SubDEdgePtr *pOVar17;
  ON_SubDVertex *pOVar18;
  unsigned_short evi;
  ON_SubDFace *face;
  ulong uVar19;
  ON_ComponentStatus allsetcheck;
  uint local_60;
  
  if ((level_index < (uint)(this->m_levels).m_count) &&
     (this_01 = (this->m_levels).m_a[level_index], this_01 != (ON_SubDLevel *)0x0)) {
    if (bMarkDeletedFaceEdges) {
      ON_SubDLevel::ClearRuntimeMarks(this_01,false,true,false);
    }
    this_00 = &this->m_heap;
    local_60 = 0;
    pOVar2 = this_01->m_face[0];
LAB_005e7e93:
    face = pOVar2;
    if (face != (ON_SubDFace *)0x0) {
      pOVar2 = face->m_next_face;
      bVar5 = ON_ComponentStatus::operator==
                        (&ON_ComponentStatus::AllSet,&(face->super_ON_SubDComponentBase).m_status);
      if ((!bVar5) && (uVar7 = face->m_edge_count, uVar7 != 0)) goto code_r0x005e7eca;
      goto LAB_005e7fa3;
    }
    allsetcheck.m_status_flags = '\0';
    allsetcheck.m_mark_bits = '\0';
    pOVar3 = this_01->m_edge[0];
    while (pOVar11 = pOVar3, pOVar11 != (ON_SubDEdge *)0x0) {
      pOVar3 = pOVar11->m_next_edge;
      uVar20._0_1_ = (pOVar11->super_ON_SubDComponentBase).m_status.m_status_flags;
      uVar20._1_1_ = (pOVar11->super_ON_SubDComponentBase).m_status.m_mark_bits;
      allsetcheck = ON_ComponentStatus::LogicalAnd
                              (ON_ComponentStatus::AllSet,(ON_ComponentStatus)uVar20);
      bVar5 = ON_ComponentStatus::operator==(&ON_ComponentStatus::AllSet,&allsetcheck);
      if (!bVar5 && bDeleteIsolatedEdges) {
        if (pOVar11->m_face_count != 0) goto LAB_005e8093;
        goto LAB_005e80f9;
      }
      if (bVar5) goto LAB_005e80f9;
LAB_005e8093:
      bVar5 = false;
      uVar7 = 0;
      while ((uVar7 < 2 && (!bVar5))) {
        if ((pOVar11->m_vertex[0] == (ON_SubDVertex *)0x0) ||
           (((pOVar11->m_vertex[1] == (ON_SubDVertex *)0x0 ||
             (bVar6 = ON_ComponentStatus::operator==
                                (&ON_ComponentStatus::AllSet,
                                 &(pOVar11->m_vertex[0]->super_ON_SubDComponentBase).m_status),
             bVar6)) ||
            (bVar6 = ON_ComponentStatus::operator==
                               (&ON_ComponentStatus::AllSet,
                                &(pOVar11->m_vertex[1]->super_ON_SubDComponentBase).m_status), bVar6
            )))) {
          bVar5 = true;
        }
        uVar7 = uVar7 + 1;
      }
      if (bVar5) {
LAB_005e80f9:
        ON_SubDLevel::RemoveEdge(this_01,pOVar11);
        ON_SubDHeap::ReturnEdge(this_00,pOVar11);
        local_60 = local_60 + 1;
      }
    }
    pOVar4 = this_01->m_vertex[0];
    while (pOVar18 = pOVar4, pOVar18 != (ON_SubDVertex *)0x0) {
      pOVar4 = pOVar18->m_next_vertex;
      uVar21._0_1_ = (pOVar18->super_ON_SubDComponentBase).m_status.m_status_flags;
      uVar21._1_1_ = (pOVar18->super_ON_SubDComponentBase).m_status.m_mark_bits;
      allsetcheck = ON_ComponentStatus::LogicalAnd
                              (ON_ComponentStatus::AllSet,(ON_ComponentStatus)uVar21);
      bVar5 = ON_ComponentStatus::operator==(&ON_ComponentStatus::AllSet,&allsetcheck);
      if (((bVar5) || ((bDeleteIsolatedEdges && (pOVar18->m_face_count == 0)))) ||
         (pOVar18->m_edge_count == 0)) {
        ON_SubDLevel::RemoveVertex(this_01,pOVar18);
        ON_SubDHeap::ReturnVertex(this_00,pOVar18);
        local_60 = local_60 + 1;
      }
    }
    if (local_60 != 0) {
      pOVar3 = this_01->m_edge[0];
      while (pOVar11 = pOVar3, pOVar11 != (ON_SubDEdge *)0x0) {
        pOVar3 = pOVar11->m_next_edge;
        uVar1 = pOVar11->m_face_count;
        pOVar11->m_face_count = 0;
        pOVar9 = pOVar11->m_face2;
        uVar7 = 0;
        pOVar14 = pOVar9;
        for (uVar12 = 0; uVar1 != uVar12; uVar12 = uVar12 + 1) {
          if (uVar12 == 2) {
            pOVar9 = pOVar11->m_facex;
          }
          uVar19 = pOVar9->m_ptr & 0xfffffffffffffff8;
          if ((uVar19 != 0) && (*(int *)(uVar19 + 0xc) != -1)) {
            pOVar14->m_ptr = pOVar9->m_ptr;
            uVar7 = uVar7 + 1;
            pOVar11->m_face_count = uVar7;
            if (uVar7 == 2) {
              pOVar14 = pOVar11->m_facex;
              uVar7 = 2;
            }
            else {
              pOVar14 = pOVar14 + 1;
            }
          }
          pOVar9 = pOVar9 + 1;
        }
        if (bDeleteIsolatedEdges && uVar7 == 0) {
          ON_SubDLevel::RemoveEdge(this_01,pOVar11);
          ON_SubDHeap::ReturnEdge(this_00,pOVar11);
          local_60 = local_60 + 1;
        }
        else {
          if ((uVar7 < 3) && (pOVar11->m_facex != (ON_SubDFacePtr *)0x0)) {
            ON_SubDHeap::ReturnEdgeExtraArray(this_00,pOVar11);
          }
          if (bUpdateTagsAndCoefficients) {
            if (pOVar11->m_face_count != 2) {
              pOVar11->m_edge_tag = Crease;
            }
            pOVar11->m_sector_coefficient[0] = -8883.0;
            pOVar11->m_sector_coefficient[1] = -8883.0;
          }
        }
      }
      pOVar4 = this_01->m_vertex[0];
      do {
        while( true ) {
          while( true ) {
            pOVar18 = pOVar4;
            if (pOVar18 == (ON_SubDVertex *)0x0) {
              if (((this_01->m_vertex_count == 0) || (this_01->m_edge_count == 0)) ||
                 ((bDeleteIsolatedEdges && (this_01->m_face_count == 0)))) {
                Destroy(this);
              }
              else {
                ON_AggregateComponentStatusEx::MarkAsNotCurrent
                          (&(this_01->m_aggregates).m_aggregate_status);
                ON_SubDLevel::ClearEvaluationCache(this_01);
                ClearHigherSubdivisionLevels(this,level_index);
                if (bUpdateTagsAndCoefficients) {
                  ON_SubDLevel::UpdateAllTagsAndSectorCoefficients(this_01,false);
                }
              }
              ChangeGeometryContentSerialNumber(this,false);
              return local_60;
            }
            pOVar4 = pOVar18->m_next_vertex;
            uVar7 = pOVar18->m_edge_count;
            pOVar18->m_edge_count = 0;
            uVar10 = 0;
            bVar5 = true;
            uVar8 = 0;
            for (uVar19 = 0; uVar7 != uVar19; uVar19 = uVar19 + 1) {
              uVar16 = pOVar18->m_edges[uVar19].m_ptr;
              uVar15 = uVar16 & 0xfffffffffffffff8;
              if ((uVar15 == 0) || (*(int *)(uVar15 + 0xc) == -1)) {
                bVar5 = false;
              }
              else {
                uVar8 = uVar8 + (*(char *)(uVar15 + 0x60) == '\x02');
                if (*(short *)(uVar15 + 100) != 2) {
                  bVar5 = false;
                }
                uVar15 = (ulong)uVar10;
                uVar10 = uVar10 + 1;
                pOVar18->m_edge_count = uVar10;
                pOVar18->m_edges[uVar15].m_ptr = uVar16;
              }
            }
            uVar7 = pOVar18->m_face_count;
            pOVar18->m_face_count = 0;
            uVar13 = 0;
            for (uVar19 = 0; uVar7 != uVar19; uVar19 = uVar19 + 1) {
              pOVar2 = pOVar18->m_faces[uVar19];
              if ((pOVar2 != (ON_SubDFace *)0x0) &&
                 ((pOVar2->super_ON_SubDComponentBase).m_archive_id != 0xffffffff)) {
                uVar16 = (ulong)uVar13;
                uVar13 = uVar13 + 1;
                pOVar18->m_face_count = uVar13;
                pOVar18->m_faces[uVar16] = pOVar2;
              }
            }
            if (uVar13 != 0 || uVar10 != 0) break;
            ON_SubDLevel::RemoveVertex(this_01,pOVar18);
            ON_SubDHeap::ReturnVertex(this_00,pOVar18);
            local_60 = local_60 + 1;
          }
          if (uVar8 == 1) break;
          if (2 < uVar8) goto LAB_005e8367;
LAB_005e8375:
          if (((!bVar5) || (uVar8 == 2)) && ((pOVar18->m_vertex_tag & ~Smooth) != Crease)) {
            pOVar18->m_vertex_tag = Crease;
          }
        }
        if (uVar13 != 0 || uVar10 != 1) goto LAB_005e8375;
LAB_005e8367:
        pOVar18->m_vertex_tag = Corner;
      } while( true );
    }
  }
  else {
    ON_SubDIncrementErrorCount();
  }
  return 0;
code_r0x005e7eca:
  pOVar17 = face->m_edge4;
  uVar10 = 0;
  bVar5 = false;
  while ((uVar10 < uVar7 && (!bVar5))) {
    if ((uVar10 == 4) && (pOVar17 = face->m_edgex, pOVar17 == (ON_SubDEdgePtr *)0x0))
    goto LAB_005e7e93;
    uVar19 = pOVar17->m_ptr & 0xfffffffffffffff8;
    if (uVar19 == 0) {
LAB_005e7f7d:
      bVar5 = true;
    }
    else if ((((*(long *)(uVar19 + 0x80) == 0) || (*(long *)(uVar19 + 0x88) == 0)) ||
             (bVar6 = ON_ComponentStatus::operator==
                                (&ON_ComponentStatus::AllSet,(ON_ComponentStatus *)(uVar19 + 0x10)),
             bVar6)) ||
            ((bVar6 = ON_ComponentStatus::operator==
                                (&ON_ComponentStatus::AllSet,
                                 (ON_ComponentStatus *)(*(long *)(uVar19 + 0x80) + 0x10)), bVar6 ||
             (bVar6 = ON_ComponentStatus::operator==
                                (&ON_ComponentStatus::AllSet,
                                 (ON_ComponentStatus *)(*(long *)(uVar19 + 0x88) + 0x10)), bVar6))))
    {
      bVar5 = ON_ComponentStatus::operator!=
                        (&ON_ComponentStatus::AllSet,(ON_ComponentStatus *)(uVar19 + 0x10));
      if (bVar5) {
        *(ON_ComponentStatus *)(uVar19 + 0x10) = ON_ComponentStatus::AllSet;
      }
      goto LAB_005e7f7d;
    }
    uVar10 = uVar10 + 1;
    pOVar17 = pOVar17 + 1;
    uVar7 = face->m_edge_count;
  }
  if (bVar5) {
LAB_005e7fa3:
    if (bMarkDeletedFaceEdges) {
      pOVar17 = face->m_edge4;
      uVar7 = 0;
      while ((uVar7 < face->m_edge_count &&
             ((uVar7 != 4 || (pOVar17 = face->m_edgex, pOVar17 != (ON_SubDEdgePtr *)0x0))))) {
        uVar19 = pOVar17->m_ptr & 0xfffffffffffffff8;
        if (uVar19 != 0) {
          ON_ComponentStatus::SetRuntimeMark((ON_ComponentStatus *)(uVar19 + 0x10));
        }
        uVar7 = uVar7 + 1;
        pOVar17 = pOVar17 + 1;
      }
    }
    ON_SubDLevel::RemoveFace(this_01,face);
    ON_SubDHeap::ReturnFace(this_00,face);
    local_60 = local_60 + 1;
  }
  goto LAB_005e7e93;
}

Assistant:

unsigned int ON_SubDimple::DeleteComponents(
  unsigned int level_index,
  bool bDeleteIsolatedEdges,
  bool bUpdateTagsAndCoefficients,
  bool bMarkDeletedFaceEdges
  )
{ 
  unsigned int deleted_component_count = 0;

  if (level_index >= m_levels.UnsignedCount())
    return ON_SUBD_RETURN_ERROR(0);

  ON_SubDLevel* level = m_levels[level_index];
  if (nullptr == level)
    return ON_SUBD_RETURN_ERROR(0);

  if (bMarkDeletedFaceEdges)
    level->ClearRuntimeMarks(false,true,false);

  ON_SubDFace* next_face = level->m_face[0];
  for (ON_SubDFace* face = next_face; nullptr != face; face = next_face)
  {
    next_face = const_cast< ON_SubDFace* >(face->m_next_face);
    bool bDelete = (ON_ComponentStatus::AllSet == face->m_status || 0 == face->m_edge_count);
    if (false == bDelete)
    {
      const ON_SubDEdgePtr* eptr = face->m_edge4;
      for (unsigned short fei = 0; fei < face->m_edge_count && false == bDelete; ++fei, ++eptr)
      {
        if (4 == fei)
        {
          eptr = face->m_edgex;
          if (nullptr == eptr)
            break;
        }
        const ON_SubDEdge* edge = ON_SUBD_EDGE_POINTER(eptr->m_ptr);
        if (nullptr == edge
          || nullptr == edge->m_vertex[0]
          || nullptr == edge->m_vertex[1]
          || ON_ComponentStatus::AllSet == edge->m_status
          || ON_ComponentStatus::AllSet == edge->m_vertex[0]->m_status
          || ON_ComponentStatus::AllSet == edge->m_vertex[1]->m_status
          )
        {
          bDelete = true;
          if (nullptr != edge && ON_ComponentStatus::AllSet != edge->m_status)
            edge->m_status = ON_ComponentStatus::AllSet;
        }
      }
      if (false == bDelete)
        continue;
    }

    if (bMarkDeletedFaceEdges)
    {
      // Set runtime mark on face's boundary edges.
      const ON_SubDEdgePtr* eptr = face->m_edge4;
      for (unsigned short fei = 0; fei < face->m_edge_count ; ++fei, ++eptr)
      {
        if (4 == fei)
        {
          eptr = face->m_edgex;
          if (nullptr == eptr)
            break;
        }
        const ON_SubDEdge* edge = ON_SUBD_EDGE_POINTER(eptr->m_ptr);
        if (nullptr != edge)
          edge->m_status.SetRuntimeMark();
      }
    }

    level->RemoveFace(face);
    m_heap.ReturnFace(face);
    deleted_component_count++;
  }

  ON_ComponentStatus allsetcheck;
  ON_SubDEdge* next_edge = level->m_edge[0];
  for (ON_SubDEdge* edge = next_edge; nullptr != edge; edge = next_edge)
  {
    next_edge = const_cast< ON_SubDEdge* >(edge->m_next_edge);
    allsetcheck = ON_ComponentStatus::LogicalAnd(ON_ComponentStatus::AllSet, edge->m_status);
    bool bDelete = (ON_ComponentStatus::AllSet == allsetcheck || (bDeleteIsolatedEdges && 0 == edge->m_face_count) );
    if (false == bDelete)
    {
      for (unsigned short evi = 0; evi < 2 && false == bDelete; evi++)
      {
        if (nullptr == edge->m_vertex[0]
          || nullptr == edge->m_vertex[1]
          || ON_ComponentStatus::AllSet == edge->m_vertex[0]->m_status
          || ON_ComponentStatus::AllSet == edge->m_vertex[1]->m_status
          )
          bDelete = true;
      }
      if (false == bDelete)
        continue;
    }

    level->RemoveEdge(edge);
    m_heap.ReturnEdge(edge);
    deleted_component_count++;
  }

  ON_SubDVertex* next_vertex = level->m_vertex[0];
  for (ON_SubDVertex* vertex = next_vertex; nullptr != vertex; vertex = next_vertex)
  {
    next_vertex = const_cast<ON_SubDVertex*>(vertex->m_next_vertex);
    allsetcheck = ON_ComponentStatus::LogicalAnd(ON_ComponentStatus::AllSet, vertex->m_status);
    bool bDelete = (ON_ComponentStatus::AllSet == allsetcheck || (bDeleteIsolatedEdges && 0 == vertex->m_face_count) || 0 == vertex->m_edge_count );
    if ( false == bDelete )
      continue;

    level->RemoveVertex(vertex);
    m_heap.ReturnVertex(vertex);
    deleted_component_count++;
  }

  if ( 0 == deleted_component_count )
    return 0;

  // Remove edge references to deleted faces
  next_edge = level->m_edge[0];
  for (ON_SubDEdge* edge = next_edge; nullptr != edge; edge = next_edge)
  {
    next_edge = const_cast<ON_SubDEdge*>(edge->m_next_edge);
    ON_SubDFacePtr* fptr0 = edge->m_face2;
    ON_SubDFacePtr* fptr1 = edge->m_face2;
    const unsigned short edge_face_count = edge->m_face_count;
    edge->m_face_count = 0;
    for (unsigned short efi = 0; efi < edge_face_count; efi++, fptr0++)
    {
      if (2 == efi)
        fptr0 = edge->m_facex;
      const ON_SubDFace* face = fptr0->Face();
      if (nullptr == face || ON_UNSET_UINT_INDEX == face->ArchiveId())
        continue;
      *fptr1++ = *fptr0;
      edge->m_face_count++;
      if (2 == edge->m_face_count)
        fptr1 = edge->m_facex;
    }

    if (0 == edge->m_face_count && bDeleteIsolatedEdges)
    {
      level->RemoveEdge(edge);
      m_heap.ReturnEdge(edge);
      deleted_component_count++;
      continue;
    }
    
    if (edge->m_face_count <= 2 && nullptr != edge->m_facex)
      m_heap.ReturnEdgeExtraArray(edge);

    if (bUpdateTagsAndCoefficients)
    {
      if (edge->m_face_count != 2)
        edge->m_edge_tag = ON_SubDEdgeTag::Crease;

      edge->m_sector_coefficient[0] = ON_SubDSectorType::UnsetSectorCoefficient;
      edge->m_sector_coefficient[1] = ON_SubDSectorType::UnsetSectorCoefficient;
    }
  }

  // Remove vertex references to deleted edges and faces
  next_vertex = level->m_vertex[0];
  for (ON_SubDVertex* vertex = next_vertex; nullptr != vertex; vertex = next_vertex)
  {
    next_vertex = const_cast<ON_SubDVertex*>(vertex->m_next_vertex);

    unsigned int count = vertex->m_edge_count;
    vertex->m_edge_count = 0;

    bool bInteriorVertex = true;
    unsigned int crease_count = 0;
    for (unsigned short vei = 0; vei < count; vei++)
    {
      const ON_SubDEdge* edge = ON_SUBD_EDGE_POINTER(vertex->m_edges[vei].m_ptr);
      if (nullptr == edge || ON_UNSET_UINT_INDEX == edge->ArchiveId())
      {
        bInteriorVertex = false;
        continue;
      }
      if (edge->IsCrease())
        crease_count++;
      if (2 != edge->m_face_count)
        bInteriorVertex = false;
      vertex->m_edges[vertex->m_edge_count++] = vertex->m_edges[vei];
    }


    count = vertex->m_face_count;
    vertex->m_face_count = 0;
    for (unsigned short vfi = 0; vfi < count; vfi++)
    {
      const ON_SubDFace* face = vertex->m_faces[vfi];
      if (nullptr == face || ON_UNSET_UINT_INDEX == face->ArchiveId()) 
        continue;
      vertex->m_faces[vertex->m_face_count++] = vertex->m_faces[vfi];
    }

    if (0 == vertex->m_face_count && 0 == vertex->m_edge_count)
    {
      level->RemoveVertex(vertex);
      m_heap.ReturnVertex(vertex);
      deleted_component_count++;
    }
    else
    {
      if (1 == crease_count && 1 == vertex->m_edge_count && 0 == vertex->m_face_count)
        vertex->m_vertex_tag = ON_SubDVertexTag::Corner;
      else if (crease_count > 2)
        vertex->m_vertex_tag = ON_SubDVertexTag::Corner;
      else if (false == bInteriorVertex || crease_count > 1)
      {
        if (false == vertex->IsCreaseOrCorner())
          vertex->m_vertex_tag = ON_SubDVertexTag::Crease;
      }
    }
  }

  if (0 == level->m_vertex_count || 0 == level->m_edge_count || (bDeleteIsolatedEdges && 0 == level->m_face_count))
  {
    Destroy();
  }
  else
  {
    // remove all information that is no longer valid
    level->MarkAggregateComponentStatusAsNotCurrent();
    level->ClearEvaluationCache();

    ClearHigherSubdivisionLevels(level_index);

    if (bUpdateTagsAndCoefficients)
    {
      // Update vertex tags, edge tags, and sector coefficients.
      level->UpdateAllTagsAndSectorCoefficients(false);
    }
  }

  ChangeGeometryContentSerialNumber(false);

  return deleted_component_count;
}